

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsModelUtils.cpp
# Opt level: O3

void writePrimalSolution(FILE *file,HighsLogOptions *log_options,HighsLp *lp,
                        vector<double,_std::allocator<double>_> *primal_solution,bool sparse)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  double val;
  pointer pbVar2;
  long lVar3;
  long lVar4;
  int iVar5;
  uint uVar6;
  ulong uVar7;
  undefined3 in_register_00000081;
  string name;
  array<char,_32UL> valStr;
  stringstream ss;
  string local_248;
  FILE *local_228;
  undefined1 *local_220;
  undefined8 local_218;
  undefined1 local_210 [16];
  string local_200;
  HighsLogOptions *local_1e0;
  HighsLp *local_1d8;
  vector<double,_std::allocator<double>_> *local_1d0;
  pointer local_1c8;
  pointer local_1c0;
  stringstream local_1b8 [16];
  undefined1 local_1a8 [112];
  ios_base local_138 [264];
  
  iVar5 = 0;
  if ((CONCAT31(in_register_00000081,sparse) != 0) && (iVar5 = 0, 0 < (long)lp->num_col_)) {
    lVar4 = 0;
    iVar5 = 0;
    do {
      iVar5 = iVar5 + (uint)((primal_solution->super__Vector_base<double,_std::allocator<double>_>).
                             _M_impl.super__Vector_impl_data._M_start[lVar4] != 0.0);
      lVar4 = lVar4 + 1;
    } while (lp->num_col_ != lVar4);
  }
  local_1c0 = (lp->col_names_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start;
  local_1c8 = (lp->col_names_).
              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish;
  local_228 = (FILE *)file;
  local_1e0 = log_options;
  local_1d0 = primal_solution;
  std::__cxx11::stringstream::stringstream(local_1b8);
  paVar1 = &local_200.field_2;
  local_200._M_string_length = 0;
  local_200.field_2._M_local_buf[0] = '\0';
  local_200._M_dataplus._M_p = (pointer)paVar1;
  std::__cxx11::stringbuf::str((string *)(local_1a8 + 8));
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != paVar1) {
    operator_delete(local_200._M_dataplus._M_p);
  }
  if (sparse) {
    uVar6 = -iVar5;
  }
  else {
    uVar6 = lp->num_col_;
  }
  highsFormatToString_abi_cxx11_(&local_200,"# Columns %d\n",(ulong)uVar6);
  std::__ostream_insert<char,std::char_traits<char>>
            ((ostream *)local_1a8,local_200._M_dataplus._M_p,local_200._M_string_length);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != paVar1) {
    operator_delete(local_200._M_dataplus._M_p);
  }
  std::__cxx11::stringbuf::str();
  highsFprintfString((FILE *)local_228,local_1e0,&local_200);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_200._M_dataplus._M_p != paVar1) {
    operator_delete(local_200._M_dataplus._M_p);
  }
  iVar5 = lp->num_col_;
  local_1d8 = lp;
  if (0 < iVar5) {
    paVar1 = &local_248.field_2;
    lVar4 = 8;
    uVar7 = 0;
    do {
      val = (local_1d0->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
            super__Vector_impl_data._M_start[uVar7];
      if (((!sparse) || (val != 0.0)) || (NAN(val))) {
        highsDoubleToString((array<char,_32UL> *)&local_200,val,1e-13);
        local_218 = 0;
        local_210[0] = 0;
        local_220 = local_210;
        std::__cxx11::stringbuf::str((string *)(local_1a8 + 8));
        if (local_220 != local_210) {
          operator_delete(local_220);
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"C",1);
        std::ostream::operator<<(local_1a8,(int)uVar7);
        if (local_1c8 == local_1c0) {
          std::__cxx11::stringbuf::str();
        }
        else {
          pbVar2 = (local_1d8->col_names_).
                   super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                   ._M_impl.super__Vector_impl_data._M_start;
          local_220 = local_210;
          lVar3 = *(long *)((long)pbVar2 + lVar4 + -8);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)&local_220,lVar3,
                     *(long *)((long)&(pbVar2->_M_dataplus)._M_p + lVar4) + lVar3);
        }
        local_248._M_string_length = 0;
        local_248.field_2._M_local_buf[0] = '\0';
        local_248._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::stringbuf::str((string *)(local_1a8 + 8));
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != paVar1) {
          operator_delete(local_248._M_dataplus._M_p);
        }
        highsFormatToString_abi_cxx11_(&local_248,"%-s %s",local_220,&local_200);
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)local_1a8,local_248._M_dataplus._M_p,local_248._M_string_length);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != paVar1) {
          operator_delete(local_248._M_dataplus._M_p);
        }
        if (sparse) {
          highsFormatToString_abi_cxx11_(&local_248," %d",uVar7 & 0xffffffff);
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)local_1a8,local_248._M_dataplus._M_p,local_248._M_string_length);
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_248._M_dataplus._M_p != paVar1) {
            operator_delete(local_248._M_dataplus._M_p);
          }
        }
        std::__ostream_insert<char,std::char_traits<char>>((ostream *)local_1a8,"\n",1);
        std::__cxx11::stringbuf::str();
        highsFprintfString((FILE *)local_228,local_1e0,&local_248);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_248._M_dataplus._M_p != paVar1) {
          operator_delete(local_248._M_dataplus._M_p);
        }
        if (local_220 != local_210) {
          operator_delete(local_220);
        }
        iVar5 = local_1d8->num_col_;
      }
      uVar7 = uVar7 + 1;
      lVar4 = lVar4 + 0x20;
    } while ((long)uVar7 < (long)iVar5);
  }
  fflush(local_228);
  std::__cxx11::stringstream::~stringstream(local_1b8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void writePrimalSolution(FILE* file, const HighsLogOptions& log_options,
                         const HighsLp& lp,
                         const std::vector<double>& primal_solution,
                         const bool sparse) {
  HighsInt num_nonzero_primal_value = 0;
  const bool have_col_names = lp.col_names_.size() > 0;
  if (sparse) {
    // Determine the number of nonzero primal solution values
    for (HighsInt iCol = 0; iCol < lp.num_col_; iCol++)
      if (primal_solution[iCol]) num_nonzero_primal_value++;
  }
  // Indicate the number of column values to be written out, depending
  // on whether format is sparse: either lp.num_col_ if not sparse, or
  // the negation of the number of nonzero values, if sparse

  std::stringstream ss;
  ss.str(std::string());
  ss << highsFormatToString("# Columns %" HIGHSINT_FORMAT "\n",
                            sparse ? -num_nonzero_primal_value : lp.num_col_);
  highsFprintfString(file, log_options, ss.str());
  for (HighsInt ix = 0; ix < lp.num_col_; ix++) {
    if (sparse && !primal_solution[ix]) continue;
    auto valStr = highsDoubleToString(primal_solution[ix],
                                      kHighsSolutionValueToStringTolerance);
    // Create a column name
    ss.str(std::string());
    ss << "C" << ix;
    const std::string name = have_col_names ? lp.col_names_[ix] : ss.str();
    ss.str(std::string());
    ss << highsFormatToString("%-s %s", name.c_str(), valStr.data());
    if (sparse) ss << highsFormatToString(" %d", int(ix));
    ss << "\n";
    highsFprintfString(file, log_options, ss.str());
  }
  fflush(file);
}